

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O0

double v3dihedral(point3d *p1,point3d *p2,point3d *p3,point3d *p4)

{
  vector3d *pvVar1;
  vector3d *pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_e0;
  double phi;
  double theta;
  double fmag;
  double emag;
  double dmag;
  vector3d f;
  vector3d e;
  vector3d d;
  vector3d c;
  vector3d b;
  vector3d a;
  point3d *p4_local;
  point3d *p3_local;
  point3d *p2_local;
  point3d *p1_local;
  
  pvVar1 = v3sub((vector3d *)p1,(vector3d *)p2,(vector3d *)&b.z);
  pvVar2 = v3sub((vector3d *)p3,(vector3d *)p2,(vector3d *)&c.z);
  v3cross(pvVar1,pvVar2,(vector3d *)&e.z);
  pvVar1 = v3sub((vector3d *)p2,(vector3d *)p3,(vector3d *)&c.z);
  pvVar2 = v3sub((vector3d *)p4,(vector3d *)p3,(vector3d *)&d.z);
  v3cross(pvVar1,pvVar2,(vector3d *)&f.z);
  dVar3 = v3length((vector3d *)&e.z);
  dVar4 = v3length((vector3d *)&f.z);
  if (0.0001 <= dVar3 * dVar4) {
    dVar5 = v3dot((vector3d *)&e.z,(vector3d *)&f.z);
    phi = acos(dVar5 / (dVar3 * dVar4));
  }
  else {
    phi = 0.0;
  }
  v3cross((vector3d *)&e.z,(vector3d *)&c.z,(vector3d *)&dmag);
  dVar3 = v3length((vector3d *)&dmag);
  if (0.0001 <= dVar3 * dVar4) {
    dVar5 = v3dot((vector3d *)&dmag,(vector3d *)&f.z);
    local_e0 = acos(dVar5 / (dVar3 * dVar4));
  }
  else {
    local_e0 = 0.0;
  }
  if (90.0 < local_e0 * 57.29578) {
    phi = -phi;
  }
  return phi;
}

Assistant:

double  v3dihedral(point3d* p1, point3d* p2, point3d* p3, point3d* p4) {
	vector3d a, b, c, d, e, f;
	double dmag, emag, fmag, theta, phi;

	v3cross(v3sub(p1, p2, &a), v3sub(p3, p2, &b), &d);
	v3cross(v3sub(p2, p3, &b), v3sub(p4, p3, &c), &e);
	dmag = v3length(&d);
	emag = v3length(&e);

	if (dmag*emag < 0.0001) { theta = 0.0; }
	else { theta = acos(v3dot(&d, &e)/(dmag*emag)); }

	v3cross(&d, &b, &f); /* this part sets the correct handedness */
	fmag = v3length(&f);
	if (fmag*emag < 0.0001) { phi = 0.0; }
	else { phi = acos(v3dot(&f, &e)/(fmag*emag)); }

	if (phi*RAD2DEG > 90.0) { theta = - theta; };

	return(theta);
}